

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::NegativeAPIWorkGroupCount::Run(NegativeAPIWorkGroupCount *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint program;
  GLenum GVar2;
  bool *compile_error;
  GLint z;
  GLint y;
  GLint x;
  int local_40;
  int local_3c;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "\nlayout(local_size_x = 1) in;\nlayout(std430) buffer Output {\n  uint g_output[];\n};\nvoid main() {\n  g_output[gl_GlobalInvocationID.x * gl_GlobalInvocationID.y * gl_GlobalInvocationID.z] = 0u;\n}"
             ,"");
  program = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_38);
  this->m_program = program;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    program = this->m_program;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  if (bVar1) {
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,100000,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glGetIntegeri_v(this_00,0x91be,0,(GLint *)&local_38);
    glu::CallLogWrapper::glGetIntegeri_v(this_00,0x91be,1,&local_3c);
    glu::CallLogWrapper::glGetIntegeri_v(this_00,0x91be,2,&local_40);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    glu::CallLogWrapper::glDispatchCompute(this_00,(int)local_38._M_dataplus._M_p + 1,1,1);
    GVar2 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar2 == 0x501) {
      glu::CallLogWrapper::glDispatchCompute(this_00,1,local_3c + 1,1);
      GVar2 = glu::CallLogWrapper::glGetError(this_00);
      if (GVar2 == 0x501) {
        glu::CallLogWrapper::glDispatchCompute(this_00,1,1,local_40 + 1);
        GVar2 = glu::CallLogWrapper::glGetError(this_00);
        if (GVar2 == 0x501) {
          return 0;
        }
      }
    }
    anon_unknown_0::Output
              (
              "INVALID_VALUE is generated by DispatchCompute if any of <num_groups_x>,\n<num_groups_y> or <num_groups_z> is greater than the value of\nMAX_COMPUTE_WORK_GROUP_COUNT for the corresponding dimension.\n"
              );
  }
  return -1;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 1) in;" NL "layout(std430) buffer Output {" NL "  uint g_output[];" NL "};" NL
			   "void main() {" NL
			   "  g_output[gl_GlobalInvocationID.x * gl_GlobalInvocationID.y * gl_GlobalInvocationID.z] = 0u;" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 100000, NULL, GL_DYNAMIC_DRAW);

		GLint x, y, z;
		glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_COUNT, 0, &x);
		glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_COUNT, 1, &y);
		glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_COUNT, 2, &z);

		glUseProgram(m_program);

		glDispatchCompute(x + 1, 1, 1);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE is generated by DispatchCompute if any of <num_groups_x>,\n"
				   "<num_groups_y> or <num_groups_z> is greater than the value of\n"
				   "MAX_COMPUTE_WORK_GROUP_COUNT for the corresponding dimension.\n");
			return ERROR;
		}

		glDispatchCompute(1, y + 1, 1);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE is generated by DispatchCompute if any of <num_groups_x>,\n"
				   "<num_groups_y> or <num_groups_z> is greater than the value of\n"
				   "MAX_COMPUTE_WORK_GROUP_COUNT for the corresponding dimension.\n");
			return ERROR;
		}

		glDispatchCompute(1, 1, z + 1);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE is generated by DispatchCompute if any of <num_groups_x>,\n"
				   "<num_groups_y> or <num_groups_z> is greater than the value of\n"
				   "MAX_COMPUTE_WORK_GROUP_COUNT for the corresponding dimension.\n");
			return ERROR;
		}

		return NO_ERROR;
	}